

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O2

int pzshape::TPZShapeLinear::NConnectShapeF(int side,int order)

{
  ostream *poVar1;
  
  if (side < 2) {
    return 1;
  }
  if (side == 2) {
    return order + -1;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "TPZShapeLinear::NConnectShapeF, bad parameter side ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,side);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int TPZShapeLinear::NConnectShapeF(int side, int order) {
		if(side<2) return 1;//0 a 4
		if(side<3) return (order-1);//6 a 14
		PZError << "TPZShapeLinear::NConnectShapeF, bad parameter side " << side << endl;
		return 0;
	}